

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QList<QByteArrayView> * __thiscall
QTimeZonePrivate::matchingTimeZoneIds(QTimeZonePrivate *this,int offsetFromUtc)

{
  ZoneData *pZVar1;
  QLatin1String *pQVar2;
  QByteArrayView *this_00;
  int in_EDX;
  QList<QByteArrayView> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  TokenizerResult<const_QLatin1String_&,_char16_t> *__range4;
  ZoneData *data;
  WindowsData *winData;
  WindowsData *__end1;
  WindowsData *__begin1;
  WindowsData (*__range1) [139];
  QList<QByteArrayView> *offsets;
  QLatin1String l1;
  sentinel __end4;
  iterator __begin4;
  rvalue_ref in_stack_fffffffffffffed8;
  iterator *in_stack_fffffffffffffee0;
  QLatin1String *in_stack_fffffffffffffee8;
  ZoneData *local_c8;
  quint16 *local_b0;
  QLatin1String local_78;
  undefined1 local_61;
  undefined1 local_60 [56];
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArrayView>::QList((QList<QByteArrayView> *)0x73a69d);
  for (local_b0 = &QtTimeZoneCldr::windowsDataTable; local_b0 != (quint16 *)&DAT_00a05f04;
      local_b0 = local_b0 + 6) {
    if (*(int *)(local_b0 + 4) == in_EDX) {
      local_c8 = zoneStartForWindowsId((quint16)((ulong)in_stack_fffffffffffffee8 >> 0x30));
      while( true ) {
        pZVar1 = std::end<QtTimeZoneCldr::ZoneData_const,361ul>
                           ((ZoneData (*) [361])&QtTimeZoneCldr::zoneDataTable);
        bVar3 = false;
        if (local_c8 != pZVar1) {
          bVar3 = local_c8->windowsIdKey == *local_b0;
        }
        if (!bVar3) break;
        QtTimeZoneCldr::ZoneData::ids((ZoneData *)in_stack_fffffffffffffee0);
        memset(local_60,0xaa,0x38);
        QStringTokenizerBase<QLatin1String,_QChar>::begin
                  ((QStringTokenizerBase<QLatin1String,_QChar> *)in_stack_fffffffffffffee0);
        local_61 = 0xaa;
        QStringTokenizerBase<QLatin1String,_QChar>::end(&local_28);
        while (bVar3 = ::operator!=(local_60), bVar3) {
          local_78.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.m_data = &DAT_aaaaaaaaaaaaaaaa;
          pQVar2 = QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*
                             ((iterator *)0x73a80b);
          local_78.m_size = pQVar2->m_size;
          local_78.m_data = pQVar2->m_data;
          in_stack_fffffffffffffee8 = &local_78;
          this_00 = (QByteArrayView *)QLatin1String::data(in_stack_fffffffffffffee8);
          QLatin1String::size(in_stack_fffffffffffffee8);
          QByteArrayView::QByteArrayView<char,_true>
                    (this_00,(char *)in_stack_fffffffffffffee8,(qsizetype)in_stack_fffffffffffffee0)
          ;
          QList<QByteArrayView>::operator<<
                    ((QList<QByteArrayView> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator++
                    (in_stack_fffffffffffffee0);
        }
        local_c8 = local_c8 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArrayView> QTimeZonePrivate::matchingTimeZoneIds(int offsetFromUtc) const
{
    // Default fall-back mode: use the zoneTable to find offsets of know zones.
    QList<QByteArrayView> offsets;
    // First get all Zones in the table using the given offset:
    for (const WindowsData &winData : windowsDataTable) {
        if (winData.offsetFromUtc == offsetFromUtc) {
            for (auto data = zoneStartForWindowsId(winData.windowsIdKey);
                 data != std::end(zoneDataTable) && data->windowsIdKey == winData.windowsIdKey;
                 ++data) {
                for (auto l1 : data->ids())
                    offsets << QByteArrayView(l1.data(), l1.size());
            }
        }
    }
    return offsets;
}